

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdGetTapBranchCount(void *handle,void *tree_handle,uint32_t *branch_count)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  reference this_00;
  reference this_01;
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_38,"TapscriptTree",&local_39);
  cfd::capi::CheckBuffer(tree_handle,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
          ((long)tree_handle + 0x18);
  if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    this_01 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                   **)((long)tree_handle + 0x10),0);
    cfd::core::TapBranch::GetBranchList
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_38,
               &this_01->super_TapBranch);
  }
  else {
    this_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0);
    cfd::core::TapBranch::GetBranchList
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_38,
               this_00);
  }
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_38);
  if (branch_count != (uint32_t *)0x0) {
    *branch_count =
         (uint32_t)((long)(local_38._M_string_length - (long)local_38._M_dataplus._M_p) / 0x78);
  }
  return 0;
}

Assistant:

int CfdGetTapBranchCount(
    void* handle, void* tree_handle, uint32_t* branch_count) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    uint32_t count;
    if (!buffer->branch_buffer->empty()) {
      count = static_cast<uint32_t>(
          buffer->branch_buffer->at(0).GetBranchList().size());
    } else {
      count = static_cast<uint32_t>(
          buffer->tree_buffer->at(0).GetBranchList().size());
    }

    if (branch_count != nullptr) *branch_count = count;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}